

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O2

void __thiscall OpenMD::SimInfo::update(SimInfo *this)

{
  setupSimVariables(this);
  this->nGlobalConstraints_ = this->nConstraints_;
  calcNdf(this);
  calcNdfRaw(this);
  calcNdfTrans(this);
  return;
}

Assistant:

void SimInfo::update() {
    setupSimVariables();
    calcNConstraints();
    calcNdf();
    calcNdfRaw();
    calcNdfTrans();
  }